

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Vector.h
# Opt level: O0

LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)__x03_>_> * __thiscall
KDIS::DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)'\x03'>_>::operator=
          (LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)__x03_>_> *this,
          LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)__x03_>_> *param_1)

{
  KFIXED<short,_(unsigned_char)__x03_> local_88;
  KFIXED<short,_(unsigned_char)__x03_> local_78;
  KFIXED<short,_(unsigned_char)__x03_> local_68;
  KFIXED<short,_(unsigned_char)__x03_> local_58 [2];
  KFIXED<short,_(unsigned_char)__x03_> local_38;
  KFIXED<short,_(unsigned_char)__x03_> local_28;
  LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)__x03_>_> *local_18;
  LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)__x03_>_> *param_1_local;
  LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)__x03_>_> *this_local;
  
  local_18 = param_1;
  param_1_local = this;
  DataTypeBase::operator=(&this->super_DataTypeBase,&param_1->super_DataTypeBase);
  KFIXED<short,_(unsigned_char)'\x03'>::KFIXED(&local_38,&local_18->m_X);
  KFIXED<short,_(unsigned_char)'\x03'>::operator=(&local_28,&this->m_X);
  KFIXED<short,_(unsigned_char)'\x03'>::~KFIXED(&local_28);
  KFIXED<short,_(unsigned_char)'\x03'>::~KFIXED(&local_38);
  KFIXED<short,_(unsigned_char)'\x03'>::KFIXED(&local_68,&local_18->m_Y);
  KFIXED<short,_(unsigned_char)'\x03'>::operator=(local_58,&this->m_Y);
  KFIXED<short,_(unsigned_char)'\x03'>::~KFIXED(local_58);
  KFIXED<short,_(unsigned_char)'\x03'>::~KFIXED(&local_68);
  KFIXED<short,_(unsigned_char)'\x03'>::KFIXED(&local_88,&local_18->m_Z);
  KFIXED<short,_(unsigned_char)'\x03'>::operator=(&local_78,&this->m_Z);
  KFIXED<short,_(unsigned_char)'\x03'>::~KFIXED(&local_78);
  KFIXED<short,_(unsigned_char)'\x03'>::~KFIXED(&local_88);
  return this;
}

Assistant:

class KDIS_EXPORT LE_Vector : public DataTypeBase
{
protected:

    Type m_X;

    Type m_Y;

    Type m_Z;

public:

    static const KUINT16 LE_VECTOR_SIZE = sizeof( typename Type::ValueType ) * 3;

    LE_Vector();

    LE_Vector( Type X, Type Y, Type Z );

    LE_Vector(KDataStream &stream) noexcept(false);

    virtual ~LE_Vector();

    //************************************
    // FullName:    KDIS::DATA_TYPE::LE_Vector::SetX
    //              KDIS::DATA_TYPE::LE_Vector::GetX
    // Description: First Value / X
    // Parameter:   Type  X
    //************************************
    void SetX( Type X );
    Type GetX() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::LE_Vector::SetY
    //              KDIS::DATA_TYPE::LE_Vector::GetY
    // Description: Second Value / Y
    // Parameter:   Type Y
    //************************************
    void SetY( Type Y );
    Type GetY() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::LE_Vector::SetZ
    //              KDIS::DATA_TYPE::LE_Vector::GetZ
    // Description: Third Value / Z
    // Parameter:   Type Z
    //************************************
    void SetZ( Type Z );
    Type GetZ() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::LE_Vector::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::LE_Vector::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::LE_Vector::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const LE_Vector & Value ) const;
    KBOOL operator != ( const LE_Vector & Value ) const;
    LE_Vector operator * ( const LE_Vector & Value ) const;
    LE_Vector operator * ( KFLOAT64 Value ) const;
    LE_Vector operator + ( const LE_Vector & Value ) const;
    LE_Vector & operator += ( const LE_Vector & Value );
    LE_Vector operator - ( const LE_Vector & Value ) const;
    LE_Vector & operator -= ( const LE_Vector & Value );

    // Valid values 0 - X, 1 - Y, 2 - Z. throws OUT_OF_BOUNDS exception for any other value.
    Type &operator[](KUINT16 i) noexcept(false);

    const Type &operator[](KUINT16 i) const noexcept(false);
}